

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
recoverKey(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *password,vector<unsigned_char,_std::allocator<unsigned_char>_> *protectedKey)

{
  allocator<unsigned_char> *paVar1;
  value_type vVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  reference pvVar8;
  value_type *pvVar9;
  const_reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  byte *pbVar13;
  key_exception *this;
  int local_14c;
  int local_148;
  int i_3;
  int i_2;
  int local_13c;
  int xorOffset;
  int i_1;
  uint8_t digest [20];
  undefined1 local_11c [8];
  SHA_CTX context;
  vector<unsigned_char,_std::allocator<unsigned_char>_> xorKey;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encrKey;
  int numRounds;
  int encrKeyLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> salt;
  uint local_50;
  uint j;
  uint i;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> passwdBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *protectedKey_local;
  string *password_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *plainKey;
  
  passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)protectedKey;
  lVar6 = std::__cxx11::string::length();
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,lVar6 * 2,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (local_50 = 0; uVar7 = std::__cxx11::string::length(), local_50 < uVar7;
      local_50 = local_50 + 1) {
    uVar7 = (ulong)salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,uVar7);
    *pvVar8 = '\0';
    pvVar9 = (value_type *)std::__cxx11::string::operator[]((ulong)password);
    vVar2 = *pvVar9;
    uVar7 = (ulong)salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,uVar7);
    *pvVar8 = vVar2;
  }
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&numRounds + 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&encrKeyLen,0x14,
             (allocator<unsigned_char> *)((long)&numRounds + 3));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&numRounds + 3));
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&encrKeyLen,0);
  pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  *(undefined8 *)pvVar8 = *(undefined8 *)pvVar10;
  *(undefined8 *)(pvVar8 + 8) = *(undefined8 *)(pvVar10 + 8);
  *(undefined4 *)(pvVar8 + 0x10) = *(undefined4 *)(pvVar10 + 0x10);
  sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar5 = (int)sVar11 + -0x28;
  encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = iVar5 / 0x14;
  if (iVar5 % 0x14 != 0) {
    encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  paVar1 = (allocator<unsigned_char> *)
           ((long)&xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,(long)iVar5,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,0);
  pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0x14);
  memcpy(pvVar8,pvVar10,(long)iVar5);
  paVar1 = (allocator<unsigned_char> *)((long)context.data + 0x3f);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&context.num,(long)iVar5,
             paVar1);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)context.data + 0x3f))
  ;
  SHA1_Init((SHA_CTX *)local_11c);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&encrKeyLen,0);
  _xorOffset = *(undefined8 *)pvVar8;
  digest._0_8_ = *(undefined8 *)(pvVar8 + 8);
  digest._8_4_ = *(undefined4 *)(pvVar8 + 0x10);
  i_2 = 0;
  for (local_13c = 0;
      local_13c <
      encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_13c = local_13c + 1) {
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    SHA1_Update((SHA_CTX *)local_11c,pvVar8,sVar12);
    SHA1_Update((SHA_CTX *)local_11c,&xorOffset,0x14);
    SHA1_Final((uchar *)&xorOffset,(SHA_CTX *)local_11c);
    SHA1_Init((SHA_CTX *)local_11c);
    if (local_13c <
        encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ + -1) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&context.num,
                          (long)i_2);
      *(undefined8 *)pvVar8 = _xorOffset;
      *(undefined8 *)(pvVar8 + 8) = digest._0_8_;
      *(undefined4 *)(pvVar8 + 0x10) = digest._8_4_;
    }
    else {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&context.num,
                          (long)i_2);
      sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&context.num);
      memcpy(pvVar8,&xorOffset,sVar12 - (long)i_2);
    }
    i_2 = i_2 + 0x14;
  }
  i_3._3_1_ = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i_3 + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)iVar5,(allocator<unsigned_char> *)((long)&i_3 + 2));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i_3 + 2));
  for (local_148 = 0; local_148 < iVar5; local_148 = local_148 + 1) {
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                         (long)local_148);
    bVar3 = *pbVar13;
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&context.num,
                         (long)local_148);
    bVar4 = *pbVar13;
    pbVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        (__return_storage_ptr__,(long)local_148);
    *pbVar13 = bVar3 ^ bVar4;
  }
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  SHA1_Update((SHA_CTX *)local_11c,pvVar8,sVar12);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,0);
  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__);
  SHA1_Update((SHA_CTX *)local_11c,pvVar8,sVar12);
  SHA1_Final((uchar *)&xorOffset,(SHA_CTX *)local_11c);
  local_14c = 0;
  while( true ) {
    if (0x13 < local_14c) {
      i_3._3_1_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&context.num);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&encrKeyLen);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      return __return_storage_ptr__;
    }
    vVar2 = *(value_type *)((long)&xorOffset + (long)local_14c);
    pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         passwdBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                         (long)((int)sVar11 + -0x14 + local_14c));
    if (vVar2 != *pvVar10) break;
    local_14c = local_14c + 1;
  }
  this = (key_exception *)__cxa_allocate_exception(0x10);
  key_exception::key_exception(this,"Key password incorrect");
  __cxa_throw(this,&key_exception::typeinfo,key_exception::~key_exception);
}

Assistant:

std::vector<uint8_t> recoverKey(const std::string& password,
                                const std::vector<uint8_t>& protectedKey)
{
    std::vector<uint8_t> passwdBytes(password.length() * 2);
    for (unsigned i = 0, j = 0; i < password.length(); i++) {
        passwdBytes[j++] = 0;
        passwdBytes[j++] = (uint8_t)password[i];
    }

    // Get the salt associated with this key (the first SALT_LEN bytes
    // protectedKey
    std::vector<uint8_t> salt(SALT_LEN);
    arraycopy8(protectedKey, 0, salt, 0, SALT_LEN);

    // Determine the number of digest rounds
    int encrKeyLen = protectedKey.size() - SALT_LEN - DIGEST_LEN;
    int numRounds = encrKeyLen / DIGEST_LEN;
    if ((encrKeyLen % DIGEST_LEN) != 0)
        numRounds++;

    // Get the encrypted key portion and store it in "encrKey"
    std::vector<uint8_t> encrKey(encrKeyLen);
    arraycopy8(protectedKey, SALT_LEN, encrKey, 0, encrKeyLen);

    // Set up the uint8_t array which will be XORed with "encrKey"
    std::vector<uint8_t> xorKey(encrKeyLen);

    SHA_CTX context;
    SHA1_Init(&context);

    uint8_t digest[DIGEST_LEN];
    arraycopy8(salt, 0, digest, 0, DIGEST_LEN);

    // Compute the digests, and store them in "xorKey"
    for (int i = 0, xorOffset = 0; i < numRounds;
         i++, xorOffset += DIGEST_LEN) {
        SHA1_Update(&context, &passwdBytes[0], passwdBytes.size());
        SHA1_Update(&context, &digest[0], DIGEST_LEN);
        SHA1_Final(&digest[0], &context);
        SHA1_Init(&context);
        // Copy the digest into "xorKey"
        if (i < numRounds - 1) {
            arraycopy8(digest, 0, xorKey, xorOffset, DIGEST_LEN);
        } else {
            arraycopy8(digest, 0, xorKey, xorOffset, xorKey.size() - xorOffset);
        }
    }

    // XOR "encrKey" with "xorKey", and store the result in "plainKey"
    std::vector<uint8_t> plainKey(encrKeyLen);
    for (int i = 0; i < encrKeyLen; i++) {
        plainKey[i] = (uint8_t)(encrKey[i] ^ xorKey[i]);
    }

    // Check the integrity of the recovered key by concatenating it with
    // the password, digesting the concatenation, and comparing the
    // result of the digest operation with the digest provided at the end
    // of 'protectedKey'. If the two digest values are
    // different, throw an exception.
    SHA1_Update(&context, &passwdBytes[0], passwdBytes.size());
    SHA1_Update(&context, &plainKey[0], plainKey.size());
    SHA1_Final(&digest[0], &context);

    for (int i = 0; i < DIGEST_LEN; i++) {
        if (digest[i] != protectedKey[SALT_LEN + encrKeyLen + i]) {
            throw key_exception("Key password incorrect");
        }
    }

    return plainKey;
}